

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.h
# Opt level: O1

bool asmjit::CodeWriterUtils::encodeOffset64(uint64_t *dst,int64_t offset64,OffsetFormat *format)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  ulong extraout_RAX;
  OffsetFormat *format_00;
  ulong uVar4;
  ulong uStack_20;
  
  bVar1 = format->_immBitCount;
  if ((bVar1 != 0) && ((uint)bVar1 <= (uint)format->_valueSize << 3)) {
    bVar2 = format->_immDiscardLsb;
    if (bVar2 != 0) {
      if (0x20 < bVar2) {
        encodeOffset64();
        bVar3 = false;
        if (format_00->_valueSize - 1 < 8) {
          uVar4 = (ulong)format_00->_valueOffset;
          bVar3 = false;
          uStack_20 = extraout_RAX;
          switch((uint)format_00->_valueSize) {
          case 1:
            bVar3 = encodeOffset32((uint32_t *)&uStack_20,offset64,format_00);
            if (bVar3) {
              *(byte *)((long)dst + uVar4) = *(byte *)((long)dst + uVar4) | (byte)uStack_20;
            }
            break;
          case 2:
            bVar3 = encodeOffset32((uint32_t *)&uStack_20,offset64,format_00);
            if (bVar3) {
              *(ushort *)((long)dst + uVar4) = *(ushort *)((long)dst + uVar4) | (ushort)uStack_20;
            }
            break;
          case 4:
            bVar3 = encodeOffset32((uint32_t *)&uStack_20,offset64,format_00);
            if (bVar3) {
              *(uint *)((long)dst + uVar4) = *(uint *)((long)dst + uVar4) | (uint)uStack_20;
            }
            break;
          case 8:
            bVar3 = encodeOffset64(&uStack_20,offset64,format_00);
            if (bVar3) {
              *(ulong *)((long)dst + uVar4) = *(ulong *)((long)dst + uVar4) | uStack_20;
            }
          }
        }
        return bVar3;
      }
      if (((~(uint)(-1L << (bVar2 & 0x3f)) | 1) & (uint)offset64) != 0) {
        return false;
      }
      offset64 = offset64 >> (bVar2 & 0x3f);
    }
    if (((offset64 << (-bVar1 & 0x3f)) >> (-bVar1 & 0x3f) == offset64) && (format->_type == '\0')) {
      *dst = ((ulong)(offset64 << (-bVar1 & 0x3f)) >> (-bVar1 & 0x3f)) <<
             (format->_immBitShift & 0x3f);
      return true;
    }
  }
  return false;
}

Assistant:

inline uint32_t immBitCount() const noexcept { return _immBitCount; }